

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

resizable_tensor * __thiscall
dlib::resizable_tensor::operator=
          (resizable_tensor *this,
          matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
          *item)

{
  longlong lVar1;
  long lVar2;
  resizable_tensor *in_RDI;
  matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
  *in_stack_00000208;
  tensor *in_stack_00000210;
  longlong in_stack_ffffffffffffffc8;
  long in_stack_ffffffffffffffd0;
  long in_stack_ffffffffffffffd8;
  
  lVar1 = tensor::num_samples(&in_RDI->super_tensor);
  lVar2 = matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
          ::nr((matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                *)0x27e98c);
  if (lVar1 == lVar2) {
    in_stack_ffffffffffffffc8 = tensor::k(&in_RDI->super_tensor);
    lVar1 = tensor::nr(&in_RDI->super_tensor);
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffc8 * lVar1;
    lVar1 = tensor::nc(&in_RDI->super_tensor);
    in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd0 * lVar1;
    lVar2 = matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
            ::nc((matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                  *)0x27e9e8);
    if (in_stack_ffffffffffffffd8 == lVar2) goto LAB_0027ea29;
  }
  lVar2 = matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
          ::nr((matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                *)0x27e9ff);
  matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
  ::nc((matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
        *)0x27ea0e);
  set_size(in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
           lVar2);
LAB_0027ea29:
  tensor::operator=(in_stack_00000210,in_stack_00000208);
  return in_RDI;
}

Assistant:

resizable_tensor& operator= (
            const matrix_exp<EXP>& item
        )
        {
            if (!(num_samples() == item.nr() && k()*nr()*nc() == item.nc()))
                set_size(item.nr(), item.nc());
            tensor::operator=(item);
            return *this;
        }